

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O0

int32_t zng_gzsetparams(gzFile file,int level,int strategy)

{
  int iVar1;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  zng_stream *strm;
  gz_state *state;
  long lVar2;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  int32_t iVar3;
  
  if (in_RDI == 0) {
    iVar3 = -2;
  }
  else if (((*(int *)(in_RDI + 0x18) == 0x79b1) && (*(int *)(in_RDI + 0x74) == 0)) &&
          (*(int *)(in_RDI + 0x40) == 0)) {
    if ((in_ESI == *(int *)(in_RDI + 0x58)) && (in_EDX == *(int *)(in_RDI + 0x5c))) {
      iVar3 = 0;
    }
    else {
      lVar2 = in_RDI;
      if (*(int *)(in_RDI + 0x70) != 0) {
        *(undefined4 *)(in_RDI + 0x70) = 0;
        iVar1 = gz_zero((gz_state *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                        in_RDI);
        if (iVar1 == -1) {
          return *(int32_t *)(in_RDI + 0x74);
        }
      }
      if (*(int *)(in_RDI + 0x28) != 0) {
        if ((*(int *)(in_RDI + 0x88) != 0) && (iVar1 = gz_comp(state,strm._4_4_), iVar1 == -1)) {
          return *(int32_t *)(in_RDI + 0x74);
        }
        zng_deflateParams((zng_stream *)
                          CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                          (int32_t)((ulong)lVar2 >> 0x20),(int32_t)lVar2);
      }
      *(int *)(in_RDI + 0x58) = in_ESI;
      *(int *)(in_RDI + 0x5c) = in_EDX;
      iVar3 = 0;
    }
  }
  else {
    iVar3 = -2;
  }
  return iVar3;
}

Assistant:

int Z_EXPORT PREFIX(gzsetparams)(gzFile file, int level, int strategy) {
    gz_state *state;
    PREFIX3(stream) *strm;

    /* get internal structure */
    if (file == NULL)
        return Z_STREAM_ERROR;
    state = (gz_state *)file;
    strm = &(state->strm);

    /* check that we're writing and that there's no error */
    if (state->mode != GZ_WRITE || state->err != Z_OK || state->direct)
        return Z_STREAM_ERROR;

    /* if no change is requested, then do nothing */
    if (level == state->level && strategy == state->strategy)
        return Z_OK;

    /* check for seek request */
    if (state->seek) {
        state->seek = 0;
        if (gz_zero(state, state->skip) == -1)
            return state->err;
    }

    /* change compression parameters for subsequent input */
    if (state->size) {
        /* flush previous input with previous parameters before changing */
        if (strm->avail_in && gz_comp(state, Z_BLOCK) == -1)
            return state->err;
        PREFIX(deflateParams)(strm, level, strategy);
    }
    state->level = level;
    state->strategy = strategy;
    return Z_OK;
}